

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticket-translation.cpp
# Opt level: O0

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
validity(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
         *__return_storage_ptr__,field *f)

{
  bool bVar1;
  iota_view<unsigned_long,_unsigned_long> iVar2;
  unsigned_long local_b8;
  uint64_t i;
  _Iterator __end2;
  _Iterator __begin2;
  unsigned_long local_90;
  iota_view<unsigned_long,_unsigned_long> local_88;
  iota_view<unsigned_long,_unsigned_long> *local_78;
  iota_view<unsigned_long,_unsigned_long> *__range2;
  pair<unsigned_long,_unsigned_long> *r;
  const_iterator __end1;
  const_iterator __begin1;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> local_38;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> *local_28;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> *__range1;
  field *local_18;
  field *f_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *valid;
  
  __range1._7_1_ = 0;
  local_18 = f;
  f_local = (field *)__return_storage_ptr__;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (__return_storage_ptr__);
  __begin1 = (const_iterator)(local_18->ranges).first.first;
  local_50 = (local_18->ranges).first.second;
  local_48 = (local_18->ranges).second.first;
  local_40 = (local_18->ranges).second.second;
  local_38._M_array = (iterator)&__begin1;
  local_38._M_len = 2;
  local_28 = &local_38;
  __end1 = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::begin(local_28);
  r = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::end(local_28);
  for (; __end1 != r; __end1 = __end1 + 1) {
    __range2 = (iota_view<unsigned_long,_unsigned_long> *)__end1;
    local_90 = __end1->second + 1;
    iVar2 = std::ranges::views::_Iota::operator()
                      ((_Iota *)&std::ranges::views::iota,&__end1->first,&local_90);
    local_78 = &local_88;
    local_88 = iVar2;
    __end2 = std::ranges::iota_view<unsigned_long,_unsigned_long>::begin(local_78);
    i = (uint64_t)std::ranges::iota_view<unsigned_long,_unsigned_long>::end(local_78);
    while( true ) {
      bVar1 = std::ranges::operator==(&__end2,(_Iterator *)&i);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_b8 = std::ranges::iota_view<unsigned_long,_unsigned_long>::_Iterator::operator*(&__end2)
      ;
      std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
      emplace<unsigned_long&>
                ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
                 __return_storage_ptr__,&local_b8);
      std::ranges::iota_view<unsigned_long,_unsigned_long>::_Iterator::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto validity(const puzzle::field & f) {
  std::set<uint64_t> valid;
  for (const auto& r : { f.ranges.first, f.ranges.second }) {
    for (uint64_t i : std::views::iota(r.first, r.second+1))
      valid.emplace(i);
  }
  return valid;
}